

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::GeneratedMessageTctableLiteTest_PackedEnumSmallRange_Test::TestBody
          (GeneratedMessageTctableLiteTest_PackedEnumSmallRange_Test *this)

{
  char *pcVar1;
  int iVar2;
  bool bVar3;
  string_view data;
  AssertHelper local_b0;
  AssertionResult gtest_ar_1;
  AssertHelper local_98;
  TestPackedEnumSmallRange empty_proto;
  TestPackedEnumSmallRange new_proto;
  TestPackedEnumSmallRange proto;
  
  proto2_unittest::TestPackedEnumSmallRange::TestPackedEnumSmallRange(&proto);
  iVar2 = 0x3ff;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    proto2_unittest::TestPackedEnumSmallRange::add_vals
              (&proto,TestPackedEnumSmallRange_NestedEnum_FOO);
  }
  proto2_unittest::TestPackedEnumSmallRange::TestPackedEnumSmallRange(&new_proto);
  MessageLite::SerializeAsString_abi_cxx11_((string *)&empty_proto,(MessageLite *)&proto);
  data._M_str._1_7_ = empty_proto.super_Message.super_MessageLite._vptr_MessageLite._1_7_;
  data._M_str._0_1_ = (char)empty_proto.super_Message.super_MessageLite._vptr_MessageLite;
  data._M_len = empty_proto.super_Message.super_MessageLite._internal_metadata_.ptr_;
  MessageLite::ParseFromString((MessageLite *)&new_proto,data);
  std::__cxx11::string::~string((string *)&empty_proto);
  local_b0.data_._0_1_ = true;
  local_b0.data_._1_3_ = 0;
  gtest_ar_1._0_4_ = local_b0.data_._0_4_;
  if ((new_proto.field_0._0_1_ & 4) != 0) {
    gtest_ar_1._0_4_ = new_proto.field_0._12_4_;
  }
  if ((proto.field_0._0_1_ & 4) != 0) {
    local_b0.data_._0_4_ = proto.field_0._12_4_;
  }
  testing::internal::CmpHelperLT<int,int>
            ((internal *)&empty_proto,"new_proto.vals().Capacity()","proto.vals().Capacity()",
             (int *)&gtest_ar_1,(int *)&local_b0);
  if ((char)empty_proto.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (empty_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)empty_proto.super_Message.super_MessageLite._internal_metadata_.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite_test.cc"
               ,0x388,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&empty_proto.super_Message.super_MessageLite._internal_metadata_);
  proto2_unittest::TestPackedEnumSmallRange::TestPackedEnumSmallRange(&empty_proto);
  RepeatedField<int>::Reserve(&empty_proto.field_0._impl_.vals_,0x3ff);
  local_b0.data_._0_4_ = 2;
  if ((new_proto.field_0._0_1_ & 4) != 0) {
    local_b0.data_._0_4_ = new_proto.field_0._12_4_;
  }
  local_98.data_._0_4_ = 2;
  if ((empty_proto.field_0._0_1_ & 4) != 0) {
    local_98.data_._0_4_ = empty_proto.field_0._12_4_;
  }
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_1,"new_proto.vals().Capacity()","empty_proto.vals().Capacity()",
             (int *)&local_b0,(int *)&local_98);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite_test.cc"
               ,0x38e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((long *)CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  proto2_unittest::TestPackedEnumSmallRange::~TestPackedEnumSmallRange(&empty_proto);
  proto2_unittest::TestPackedEnumSmallRange::~TestPackedEnumSmallRange(&new_proto);
  proto2_unittest::TestPackedEnumSmallRange::~TestPackedEnumSmallRange(&proto);
  return;
}

Assistant:

TEST(GeneratedMessageTctableLiteTest, PackedEnumSmallRange) {
  // RepeatedField::Reserve(n) may set the capacity to something greater than n,
  // and this "upgrade" algorithm can even be different depending on compiler
  // optimizations!  This value is chosen such that -- with the current
  // implementation of Reserve() -- Reserve(kNumVals) always results in a
  // different final capacity than you'd get by adding elements one at a time.
  constexpr int kNumVals = 1023;
  proto2_unittest::TestPackedEnumSmallRange proto;
  for (int i = 0; i < kNumVals; i++) {
    proto.add_vals(proto2_unittest::TestPackedEnumSmallRange::FOO);
  }

  proto2_unittest::TestPackedEnumSmallRange new_proto;
  new_proto.ParseFromString(proto.SerializeAsString());

  // We should have reserved exactly the right size for new_proto's `vals`,
  // rather than growing it on demand like we did in `proto`.
  EXPECT_LT(new_proto.vals().Capacity(), proto.vals().Capacity());

  // Check that new_proto's capacity is equal to exactly what we'd get from
  // calling Reserve(n).
  proto2_unittest::TestPackedEnumSmallRange empty_proto;
  empty_proto.mutable_vals()->Reserve(kNumVals);
  EXPECT_EQ(new_proto.vals().Capacity(), empty_proto.vals().Capacity());
}